

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_errmsg(CPState *cp,CPToken tok,ErrMsg em,...)

{
  uint uVar1;
  lua_State *in_RCX;
  int in_ESI;
  long in_RDI;
  __va_list_tag *in_stack_00000068;
  char *in_stack_00000070;
  lua_State *in_stack_00000078;
  va_list argp;
  lua_State *L;
  char *tokstr;
  char *msg;
  undefined4 in_stack_fffffffffffffee8;
  CPChar in_stack_fffffffffffffeec;
  CPState *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  lua_State *L_00;
  char *pcVar2;
  char *local_38;
  
  if (in_ESI == 0) {
    pcVar2 = (char *)0x0;
  }
  else if ((((in_ESI == 0x100) || (in_ESI == 0x102)) || (in_ESI == 0x101)) || (0x10c < in_ESI)) {
    if (*(int *)(in_RDI + 0x30) == 0) {
      if (*(uint *)(in_RDI + 0x34) < *(int *)(in_RDI + 0x30) + 1U) {
        cp_save_grow(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
      }
      else {
        uVar1 = *(uint *)(in_RDI + 0x30);
        *(uint *)(in_RDI + 0x30) = uVar1 + 1;
        *(undefined1 *)(*(long *)(in_RDI + 0x28) + (ulong)uVar1) = 0x24;
      }
    }
    if (*(uint *)(in_RDI + 0x34) < *(int *)(in_RDI + 0x30) + 1U) {
      cp_save_grow(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    }
    else {
      uVar1 = *(uint *)(in_RDI + 0x30);
      *(uint *)(in_RDI + 0x30) = uVar1 + 1;
      *(undefined1 *)(*(long *)(in_RDI + 0x28) + (ulong)uVar1) = 0;
    }
    pcVar2 = *(char **)(in_RDI + 0x28);
  }
  else {
    pcVar2 = cp_tok2str((CPState *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0);
  }
  L_00 = *(lua_State **)(in_RDI + 0x38);
  local_38 = lj_str_pushvf(in_stack_00000078,in_stack_00000070,in_stack_00000068);
  if (pcVar2 != (char *)0x0) {
    local_38 = lj_str_pushf(L_00,lj_err_allmsg + 0x8c4,local_38,pcVar2);
  }
  if (1 < *(int *)(in_RDI + 0x58)) {
    lj_str_pushf(L_00,"%s at line %d",local_38,(ulong)*(uint *)(in_RDI + 0x58));
  }
  lj_err_callermsg(in_RCX,in_stack_fffffffffffffef8);
}

Assistant:

LJ_NORET static void cp_errmsg(CPState *cp, CPToken tok, ErrMsg em, ...)
{
  const char *msg, *tokstr;
  lua_State *L;
  va_list argp;
  if (tok == 0) {
    tokstr = NULL;
  } else if (tok == CTOK_IDENT || tok == CTOK_INTEGER || tok == CTOK_STRING ||
	     tok >= CTOK_FIRSTDECL) {
    if (cp->sb.n == 0) cp_save(cp, '$');
    cp_save(cp, '\0');
    tokstr = cp->sb.buf;
  } else {
    tokstr = cp_tok2str(cp, tok);
  }
  L = cp->L;
  va_start(argp, em);
  msg = lj_str_pushvf(L, err2msg(em), argp);
  va_end(argp);
  if (tokstr)
    msg = lj_str_pushf(L, err2msg(LJ_ERR_XNEAR), msg, tokstr);
  if (cp->linenumber > 1)
    msg = lj_str_pushf(L, "%s at line %d", msg, cp->linenumber);
  lj_err_callermsg(L, msg);
}